

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  pointer pPVar1;
  pointer pTVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  Vector VVar10;
  undefined1 auStack_1c0 [8];
  RayTracerTriangles tracer;
  void *local_d0;
  pointer local_c0;
  pointer pSStack_b8;
  pointer pPStack_a8;
  pointer local_a0;
  iterator iStack_98;
  pointer local_90;
  float local_84;
  float local_80;
  float local_7c;
  undefined1 local_78 [32];
  float local_58;
  uint8_t uStack_54;
  uint8_t uStack_53;
  uint8_t uStack_52;
  uint8_t uStack_51;
  uint8_t uStack_50;
  uint8_t uStack_4f;
  uint8_t uStack_4e;
  uint8_t uStack_4d;
  uint uStack_4c;
  Vector local_48;
  float fStack_3c;
  int local_38;
  allocator local_31;
  
  tracer.kdTree = (KdNode *)0x100000002;
  local_a0 = (pointer)0x0;
  iStack_98._M_current = (Triangle *)0x0;
  local_90 = (pointer)0x0;
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Using default config",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    RayTracerConfig::defaultConfig();
    pTVar2 = local_90;
    pPVar1 = local_a0;
    local_d0 = (void *)tracer.super_RayTracerBase.config._48_8_;
    local_c0 = tracer.super_RayTracerBase.config.spheres.
               super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
               _M_finish;
    pSStack_b8 = tracer.super_RayTracerBase.config.spheres.
                 super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data
                 ._M_end_of_storage;
    pPStack_a8 = tracer.super_RayTracerBase.config.planes.
                 super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
    tracer.kdTree = (KdNode *)auStack_1c0;
    tracer.super_RayTracerBase.config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tracer.super_RayTracerBase.config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tracer.super_RayTracerBase.config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tracer.super_RayTracerBase.config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tracer.super_RayTracerBase.config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tracer.super_RayTracerBase.config.super_BaseConfig.background.r = '\0';
    tracer.super_RayTracerBase.config.super_BaseConfig.background.g = '\0';
    tracer.super_RayTracerBase.config.super_BaseConfig.background.b = '\0';
    tracer.super_RayTracerBase.config.super_BaseConfig._51_1_ = 0;
    tracer.super_RayTracerBase.config._52_4_ = 0;
    local_a0 = tracer.super_RayTracerBase.config.planes.
               super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
    iStack_98._M_current =
         tracer.super_RayTracerBase.config.triangles.
         super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.super__Vector_impl_data.
         _M_start;
    local_90 = tracer.super_RayTracerBase.config.triangles.
               super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
               super__Vector_impl_data._M_finish;
    tracer.super_RayTracerBase.config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tracer.super_RayTracerBase.config.triangles.
    super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    tracer.super_RayTracerBase.config.triangles.
    super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    if (pPVar1 != (pointer)0x0) {
      operator_delete(pPVar1,(long)pTVar2 - (long)pPVar1);
    }
    if (tracer.super_RayTracerBase.config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(tracer.super_RayTracerBase.config.planes.
                      super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                      (long)tracer.super_RayTracerBase.config.triangles.
                            super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)tracer.super_RayTracerBase.config.planes.
                            super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
    }
    if (tracer.super_RayTracerBase.config.spheres.
        super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (pointer)0x0) {
      operator_delete(tracer.super_RayTracerBase.config.spheres.
                      super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                      (long)tracer.super_RayTracerBase.config.planes.
                            super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)tracer.super_RayTracerBase.config.spheres.
                            super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
    }
    if (tracer.super_RayTracerBase.config._48_8_ != 0) {
      operator_delete((void *)tracer.super_RayTracerBase.config._48_8_,
                      (long)tracer.super_RayTracerBase.config.spheres.
                            super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      tracer.super_RayTracerBase.config._48_8_);
    }
    tracer.super_RayTracerBase.config.super_BaseConfig.light.y._0_3_ = 0;
    tracer.super_RayTracerBase.config.super_BaseConfig.light._7_5_ = 0;
    tracer.super_RayTracerBase.config.super_BaseConfig.background.r = '\0';
    tracer.super_RayTracerBase.config.super_BaseConfig.background.g = '\0';
    tracer.super_RayTracerBase.config.super_BaseConfig.background.b = '\0';
    tracer.super_RayTracerBase.config.super_BaseConfig._51_1_ = 0;
    tracer.super_RayTracerBase.config._52_4_ = 0x3dcccccd;
    auStack_1c0 = (undefined1  [8])0xc3480000451c4000;
    tracer.super_RayTracerBase.config.super_BaseConfig.antiAliasing = -0x3bea0000;
    tracer.super_RayTracerBase.config.super_BaseConfig.maxRecursionLevel = 0x451c4000;
    tracer.super_RayTracerBase.config.super_BaseConfig.ambientCoefficient = 600.0;
    tracer.super_RayTracerBase.config.super_BaseConfig.imageX = 0;
    tracer.super_RayTracerBase.config.super_BaseConfig.imageY = 0x451c4000;
    tracer.super_RayTracerBase.config.super_BaseConfig.imageZ = 0x43480000;
    tracer.super_RayTracerBase.config.super_BaseConfig.observer.x = 300.0;
    tracer.super_RayTracerBase.config.super_BaseConfig.observer.y = -409600.0;
    tracer.super_RayTracerBase.config.super_BaseConfig.observer.z = -131072.0;
    tracer.super_RayTracerBase.config.super_BaseConfig.light.x._0_1_ = 0;
    VVar10 = getNormalVector((Triangle *)auStack_1c0);
    tracer.super_RayTracerBase.config.super_BaseConfig.light.y._0_3_ = VVar10.x._0_3_;
    tracer.super_RayTracerBase.config.super_BaseConfig.light._7_5_ = VVar10._3_5_;
    tracer.super_RayTracerBase.config.super_BaseConfig._48_4_ = VVar10.z;
    if (iStack_98._M_current == local_90) {
      std::vector<Triangle,std::allocator<Triangle>>::_M_realloc_insert<Triangle_const&>
                ((vector<Triangle,std::allocator<Triangle>> *)&local_a0,iStack_98,
                 (Triangle *)auStack_1c0);
    }
    else {
      ((iStack_98._M_current)->normal).x = (float)(int)VVar10._0_8_;
      ((iStack_98._M_current)->normal).y = (float)(int)((ulong)VVar10._0_8_ >> 0x20);
      *(undefined8 *)&((iStack_98._M_current)->normal).z = tracer.super_RayTracerBase.config._48_8_;
      *(ulong *)&((iStack_98._M_current)->z).z =
           CONCAT44(tracer.super_RayTracerBase.config.super_BaseConfig.observer.y,
                    tracer.super_RayTracerBase.config.super_BaseConfig.observer.x);
      *(ulong *)&((iStack_98._M_current)->colorY).g =
           CONCAT17(tracer.super_RayTracerBase.config.super_BaseConfig.light.x._3_1_,
                    CONCAT25(tracer.super_RayTracerBase.config.super_BaseConfig.light.x._1_2_,
                             CONCAT14(tracer.super_RayTracerBase.config.super_BaseConfig.light.x.
                                      _0_1_,tracer.super_RayTracerBase.config.super_BaseConfig.
                                            observer.z)));
      ((iStack_98._M_current)->y).y =
           tracer.super_RayTracerBase.config.super_BaseConfig.ambientCoefficient;
      ((iStack_98._M_current)->y).z =
           (float)tracer.super_RayTracerBase.config.super_BaseConfig.imageX;
      ((iStack_98._M_current)->z).x =
           (float)tracer.super_RayTracerBase.config.super_BaseConfig.imageY;
      ((iStack_98._M_current)->z).y =
           (float)tracer.super_RayTracerBase.config.super_BaseConfig.imageZ;
      ((iStack_98._M_current)->x).x = (float)auStack_1c0._0_4_;
      ((iStack_98._M_current)->x).y = (float)auStack_1c0._4_4_;
      *(undefined8 *)&((iStack_98._M_current)->x).z =
           tracer.super_RayTracerBase.config.super_BaseConfig._0_8_;
      iStack_98._M_current = iStack_98._M_current + 1;
    }
    iVar3 = 0x14;
    do {
      local_38 = iVar3;
      iVar3 = rand();
      local_84 = (float)(iVar3 % 5000 + 1000);
      iVar4 = rand();
      local_80 = (float)(iVar4 % 3000 + -800);
      iVar5 = rand();
      local_7c = (float)(iVar5 % 5000 + -2000);
      iVar6 = rand();
      iVar7 = rand();
      iVar8 = rand();
      local_48.x = 0.0;
      local_48.y = 0.0;
      local_48.z = 0.0;
      uStack_54 = '\0';
      uStack_53 = '\0';
      uStack_52 = '\0';
      uStack_51 = '\0';
      uStack_50 = '\0';
      uStack_4f = '\0';
      uStack_4e = '\0';
      uStack_4d = '\0';
      uStack_4c = uStack_4c & 0xffffff00;
      fStack_3c = 0.1;
      local_78._0_4_ = local_84;
      local_78._16_4_ = (undefined4)(iVar4 % 3000 + -0x316 + iVar7 % 400);
      local_78._20_4_ = (undefined4)(iVar5 % 5000 + -0x7c6 + iVar8 % 400);
      local_78._4_4_ = local_80;
      local_78._8_4_ = local_7c;
      local_78._12_4_ = local_84;
      local_78._24_4_ = (undefined4)(iVar3 % 5000 + 0x3f2 + iVar6 % 400);
      local_58 = local_7c;
      local_78._28_4_ = local_78._16_4_;
      iVar3 = rand();
      iVar4 = rand();
      iVar5 = rand();
      uStack_52 = (char)iVar5 +
                  ((char)(uint)((ulong)((long)iVar5 * 0x51eb851f) >> 0x26) - (char)(iVar5 >> 0x1f))
                  * '8';
      uStack_54 = (char)iVar3 +
                  ((char)(uint)((ulong)((long)iVar3 * 0x51eb851f) >> 0x26) - (char)(iVar3 >> 0x1f))
                  * '8';
      uStack_53 = (char)iVar4 +
                  ((char)(uint)((ulong)((long)iVar4 * 0x51eb851f) >> 0x26) - (char)(iVar4 >> 0x1f))
                  * '8';
      iVar3 = rand();
      iVar4 = rand();
      iVar5 = rand();
      uStack_4f = (char)iVar5 +
                  ((char)(uint)((ulong)((long)iVar5 * 0x51eb851f) >> 0x26) - (char)(iVar5 >> 0x1f))
                  * '8';
      uStack_51 = (char)iVar3 +
                  ((char)(uint)((ulong)((long)iVar3 * 0x51eb851f) >> 0x26) - (char)(iVar3 >> 0x1f))
                  * '8';
      uStack_50 = (char)iVar4 +
                  ((char)(uint)((ulong)((long)iVar4 * 0x51eb851f) >> 0x26) - (char)(iVar4 >> 0x1f))
                  * '8';
      iVar3 = rand();
      iVar4 = rand();
      iVar5 = rand();
      uStack_4c = CONCAT31(uStack_4c._1_3_,
                           (char)iVar5 +
                           ((char)(uint)((ulong)((long)iVar5 * 0x51eb851f) >> 0x26) -
                           (char)(iVar5 >> 0x1f)) * '8');
      fStack_3c = 0.1;
      uStack_4e = (char)iVar3 +
                  ((char)(uint)((ulong)((long)iVar3 * 0x51eb851f) >> 0x26) - (char)(iVar3 >> 0x1f))
                  * '8';
      uStack_4d = (char)iVar4 +
                  ((char)(uint)((ulong)((long)iVar4 * 0x51eb851f) >> 0x26) - (char)(iVar4 >> 0x1f))
                  * '8';
      VVar10 = getNormalVector((Triangle *)local_78);
      local_48.z = VVar10.z;
      local_48._0_8_ = VVar10._0_8_;
      if (iStack_98._M_current == local_90) {
        std::vector<Triangle,std::allocator<Triangle>>::_M_realloc_insert<Triangle_const&>
                  ((vector<Triangle,std::allocator<Triangle>> *)&local_a0,iStack_98,
                   (Triangle *)local_78);
      }
      else {
        ((iStack_98._M_current)->normal).x = local_48.x;
        ((iStack_98._M_current)->normal).y = local_48.y;
        *(ulong *)&((iStack_98._M_current)->normal).z = CONCAT44(fStack_3c,local_48.z);
        *(ulong *)&((iStack_98._M_current)->z).z =
             CONCAT17(uStack_51,CONCAT16(uStack_52,CONCAT15(uStack_53,CONCAT14(uStack_54,local_58)))
                     );
        *(ulong *)&((iStack_98._M_current)->colorY).g =
             CONCAT44(uStack_4c,
                      CONCAT13(uStack_4d,CONCAT12(uStack_4e,CONCAT11(uStack_4f,uStack_50))));
        ((iStack_98._M_current)->y).y = (float)local_78._16_4_;
        ((iStack_98._M_current)->y).z = (float)local_78._20_4_;
        ((iStack_98._M_current)->z).x = (float)local_78._24_4_;
        ((iStack_98._M_current)->z).y = (float)local_78._28_4_;
        ((iStack_98._M_current)->x).x = (float)local_78._0_4_;
        ((iStack_98._M_current)->x).y = (float)local_78._4_4_;
        *(ulong *)&((iStack_98._M_current)->x).z = CONCAT44(local_78._12_4_,local_78._8_4_);
        iStack_98._M_current = iStack_98._M_current + 1;
      }
      iVar3 = local_38 + -1;
    } while (iVar3 != 0);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Reading config from file ",0x19);
    __s = argv[1];
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1101b8);
    }
    else {
      sVar9 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    std::__cxx11::string::string((string *)local_78,argv[1],&local_31);
    RayTracerConfig::fromPlyFile((RayTracerConfig *)auStack_1c0,(string *)local_78);
    pTVar2 = local_90;
    pPVar1 = local_a0;
    local_d0 = (void *)tracer.super_RayTracerBase.config._48_8_;
    local_c0 = tracer.super_RayTracerBase.config.spheres.
               super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
               _M_finish;
    pSStack_b8 = tracer.super_RayTracerBase.config.spheres.
                 super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data
                 ._M_end_of_storage;
    pPStack_a8 = tracer.super_RayTracerBase.config.planes.
                 super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
    tracer.super_RayTracerBase.config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tracer.super_RayTracerBase.config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tracer.super_RayTracerBase.config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tracer.super_RayTracerBase.config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tracer.super_RayTracerBase.config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tracer.super_RayTracerBase.config.super_BaseConfig.background.r = '\0';
    tracer.super_RayTracerBase.config.super_BaseConfig.background.g = '\0';
    tracer.super_RayTracerBase.config.super_BaseConfig.background.b = '\0';
    tracer.super_RayTracerBase.config.super_BaseConfig._51_1_ = 0;
    tracer.super_RayTracerBase.config._52_4_ = 0;
    local_a0 = tracer.super_RayTracerBase.config.planes.
               super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
    iStack_98._M_current =
         tracer.super_RayTracerBase.config.triangles.
         super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.super__Vector_impl_data.
         _M_start;
    local_90 = tracer.super_RayTracerBase.config.triangles.
               super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
               super__Vector_impl_data._M_finish;
    tracer.super_RayTracerBase.config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tracer.super_RayTracerBase.config.triangles.
    super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    tracer.super_RayTracerBase.config.triangles.
    super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    if (pPVar1 != (pointer)0x0) {
      operator_delete(pPVar1,(long)pTVar2 - (long)pPVar1);
    }
    if (tracer.super_RayTracerBase.config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(tracer.super_RayTracerBase.config.planes.
                      super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                      (long)tracer.super_RayTracerBase.config.triangles.
                            super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)tracer.super_RayTracerBase.config.planes.
                            super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
    }
    if (tracer.super_RayTracerBase.config.spheres.
        super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (pointer)0x0) {
      operator_delete(tracer.super_RayTracerBase.config.spheres.
                      super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                      (long)tracer.super_RayTracerBase.config.planes.
                            super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)tracer.super_RayTracerBase.config.spheres.
                            super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
    }
    if (tracer.super_RayTracerBase.config._48_8_ != 0) {
      operator_delete((void *)tracer.super_RayTracerBase.config._48_8_,
                      (long)tracer.super_RayTracerBase.config.spheres.
                            super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      tracer.super_RayTracerBase.config._48_8_);
    }
    if ((undefined1 *)CONCAT44(local_78._4_4_,local_78._0_4_) != local_78 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_78._4_4_,local_78._0_4_),
                      CONCAT44(local_78._20_4_,local_78._16_4_) + 1);
    }
    tracer.kdTree = (KdNode *)0x100000002;
    RayTracerConfig::scaleTriangles((RayTracerConfig *)&tracer.kdTree);
  }
  RayTracerTriangles::RayTracerTriangles
            ((RayTracerTriangles *)auStack_1c0,(RayTracerConfig *)&tracer.kdTree);
  RayTracerTriangles::processPixels((RayTracerTriangles *)auStack_1c0);
  RayTracerBase::printBitmap((RayTracerBase *)auStack_1c0,(ostream *)&std::cout);
  if (tracer.super_RayTracerBase.bitmap.cols != 0) {
    operator_delete((void *)tracer.super_RayTracerBase.bitmap.cols,
                    (long)tracer.super_RayTracerBase.bitmap.data_.
                          super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                          super__Vector_impl_data._M_finish - tracer.super_RayTracerBase.bitmap.cols
                   );
  }
  if (tracer.super_RayTracerBase.config.planes.super__Vector_base<Plane,_std::allocator<Plane>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(tracer.super_RayTracerBase.config.planes.
                    super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)tracer.super_RayTracerBase.config.triangles.
                          super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)tracer.super_RayTracerBase.config.planes.
                          super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (tracer.super_RayTracerBase.config.spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(tracer.super_RayTracerBase.config.spheres.
                    super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)tracer.super_RayTracerBase.config.planes.
                          super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)tracer.super_RayTracerBase.config.spheres.
                          super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (tracer.super_RayTracerBase.config._48_8_ != 0) {
    operator_delete((void *)tracer.super_RayTracerBase.config._48_8_,
                    (long)tracer.super_RayTracerBase.config.spheres.
                          super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    tracer.super_RayTracerBase.config._48_8_);
  }
  if (local_a0 != (pointer)0x0) {
    operator_delete(local_a0,(long)local_90 - (long)local_a0);
  }
  if (pSStack_b8 != (pointer)0x0) {
    operator_delete(pSStack_b8,(long)pPStack_a8 - (long)pSStack_b8);
  }
  if (local_d0 != (void *)0x0) {
    operator_delete(local_d0,(long)local_c0 - (long)local_d0);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
  RayTracerConfig config;
  if (argc > 1)
  {
    std::cerr << "Reading config from file " << argv[1] << std::endl;
    config = RayTracerConfig::fromPlyFile(argv[1]);
    config.antiAliasing = 2;
    config.maxRecursionLevel = 1;
    config.ambientCoefficient = 0.1;
    config.imageX = 512;
    config.imageY = 768;
    //config.imageY = 500;
    config.imageZ = 1024;
    //config.imageZ = 500;
    config.observer = {0, 0, 0};
    config.light = {200, 1000, 200};
    config.scaleTriangles();
    config.background = {255, 255, 255};
  }
  else
  {
    std::cerr << "Using default config" << std::endl;
    config = RayTracerConfig::defaultConfig();

    Triangle tr;
    tr.x = {2500, -200, -600};
    tr.y = {2500, 600, 0};
    tr.z = {2500, 200, 300};
    tr.colorX = {0, 0, 200};
    tr.colorY = {200, 0, 0};
    tr.colorZ = {0, 200, 0};
    tr.reflectionCoefficient = 0.1;
    tr.normal = getNormalVector(tr);

    config.triangles.push_back(tr);


    for (int i = 0; i < 20; i++)
    {
      float x = rand() % 5000 + 1000.0;
      float y = rand() % 3000 - 800.0;
      float z = rand() % 5000 - 2000.0;

      float xx = rand() % 400 + 10.0;
      float yy = rand() % 400 + 10.0;
      float zz = rand() % 400 + 10.0;

      Triangle triangle;
      triangle.x = {x, y, z};
      triangle.y = {x, y + yy, z + zz};
      triangle.z = {x + xx, y + yy, z};

      triangle.colorX = {uint8_t(rand() % 200), uint8_t(rand() % 200), uint8_t(rand() % 200)};
      triangle.colorY = {uint8_t(rand() % 200), uint8_t(rand() % 200), uint8_t(rand() % 200)};
      triangle.colorZ = {uint8_t(rand() % 200), uint8_t(rand() % 200), uint8_t(rand() % 200)};
      triangle.reflectionCoefficient = 0.1;
      triangle.normal = getNormalVector(triangle);

      config.triangles.push_back(triangle);
    }
  }
  // std::cerr << config;

  RayTracerTriangles tracer(config);
  tracer.processPixels();
  tracer.printBitmap(std::cout);
}